

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

float * Abc_NtkGetCoRequiredFloats(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pNode_00;
  float fVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pNode;
  float *p;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = Abc_NtkCoNum(pNtk);
    pNtk_local = (Abc_Ntk_t *)calloc((long)iVar1,4);
    for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pNode_00 = Abc_NtkCo(pNtk,local_2c);
      fVar2 = Abc_NodeReadRequiredWorst(pNode_00);
      pNtk_local->nObjCounts[(long)local_2c + -0x18] = (int)fVar2;
    }
  }
  return (float *)pNtk_local;
}

Assistant:

float * Abc_NtkGetCoRequiredFloats( Abc_Ntk_t * pNtk )
{
    float * p;
    Abc_Obj_t * pNode;
    int i;
    if ( pNtk->pManTime == NULL )
        return NULL;
    // set the PO required times
    p = ABC_CALLOC( float, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        p[i] = Abc_NodeReadRequiredWorst(pNode);
    return p;
}